

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_measurement *
units::measurement_from_string
          (precise_measurement *__return_storage_ptr__,string *measurement_string,
          uint64_t match_flags)

{
  bool bVar1;
  uint32_t commodity_code;
  unit_data base;
  ulong uVar2;
  double dVar3;
  double dVar4;
  precise_unit pVar5;
  byte local_202;
  string local_158;
  undefined1 local_138 [8];
  precise_unit unit;
  undefined1 local_108 [8];
  precise_measurement mstr;
  undefined1 local_d0 [8];
  precise_unit c;
  precise_unit local_b8;
  unit_data local_a4;
  unit_data local_a0;
  byte local_99;
  string local_98;
  undefined1 local_78 [8];
  precise_unit un;
  undefined1 local_50 [7];
  bool validString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  double dStack_28;
  bool checkCurrency;
  double val;
  size_t loc;
  uint64_t match_flags_local;
  string *measurement_string_local;
  
  loc = match_flags;
  match_flags_local = (uint64_t)measurement_string;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    precise_measurement::precise_measurement(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  loc = loc & 0xffffffefffffffff;
  cleanUnitString(measurement_string,loc);
  val = 0.0;
  dStack_28 = generateLeadingNumber(measurement_string,(size_t *)&val);
  if (val == 0.0) {
    dStack_28 = readNumericalWords(measurement_string,(size_t *)&val);
  }
  dVar4 = val;
  if (val == 0.0) {
    dStack_28 = 1.0;
  }
  dVar3 = (double)std::__cxx11::string::length();
  if ((ulong)dVar3 <= (ulong)dVar4) {
    precise_measurement::precise_measurement
              (__return_storage_ptr__,dStack_28,(precise_unit *)&precise::one);
    return __return_storage_ptr__;
  }
  ustring.field_2._M_local_buf[0xf] = val == 0.0;
  std::__cxx11::string::substr((ulong)local_50,(ulong)measurement_string);
  bVar1 = checkValidUnitString((string *)local_50,loc);
  local_99 = 0;
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_98,(string *)local_50);
    local_99 = 1;
    pVar5 = unit_from_string_internal(&local_98,loc | 0x1000000000);
  }
  else {
    pVar5.base_units_ = (unit_data)0xfa94a488;
    pVar5.commodity_ = 0;
    pVar5.multiplier_ = NAN;
  }
  un.multiplier_ = pVar5._8_8_;
  local_78 = (undefined1  [8])pVar5.multiplier_;
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
    pVar5._8_8_ = un.multiplier_;
    pVar5.multiplier_ = (double)local_78;
  }
  un.multiplier_ = pVar5._8_8_;
  local_78 = (undefined1  [8])pVar5.multiplier_;
  bVar1 = is_error((precise_unit *)local_78);
  if (bVar1) {
    if ((ustring.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::substr((ulong)&mstr.units_.base_units_,(ulong)measurement_string);
      pVar5 = get_unit((string *)&mstr.units_.base_units_,loc);
      c.multiplier_ = pVar5._8_8_;
      local_d0 = (undefined1  [8])pVar5.multiplier_;
      std::__cxx11::string::~string((string *)&mstr.units_.base_units_);
      bVar1 = precise_unit::operator==((precise_unit *)local_d0,(precise_unit *)precise::currency);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&unit.base_units_,(ulong)measurement_string);
        measurement_from_string((precise_measurement *)local_108,(string *)&unit.base_units_,loc);
        std::__cxx11::string::~string((string *)&unit.base_units_);
        precise_measurement::operator*
                  (__return_storage_ptr__,(precise_measurement *)local_108,(precise_unit *)local_d0)
        ;
        goto LAB_0018b5ec;
      }
    }
    std::__cxx11::string::string((string *)&local_158,(string *)measurement_string);
    pVar5 = unit_from_string_internal(&local_158,loc | 0x1000000000);
    unit.multiplier_ = pVar5._8_8_;
    local_138 = (undefined1  [8])pVar5.multiplier_;
    std::__cxx11::string::~string((string *)&local_158);
    bVar1 = is_valid((precise_unit *)local_138);
    local_202 = 0;
    if (bVar1) {
      base = units::unit::base_units((unit *)&one);
      bVar1 = precise_unit::has_same_base((precise_unit *)local_138,base);
      local_202 = bVar1 ^ 0xff;
    }
    if ((local_202 & 1) == 0) {
      precise_measurement::precise_measurement
                (__return_storage_ptr__,dStack_28,(precise_unit *)&precise::invalid);
    }
    else {
      precise_measurement::precise_measurement(__return_storage_ptr__,1.0,(precise_unit *)local_138)
      ;
    }
  }
  else {
    if ((ustring.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_a0 = precise_unit::base_units((precise_unit *)local_78);
      local_a4 = precise_unit::base_units((precise_unit *)precise::currency);
      bVar1 = detail::unit_data::operator==(&local_a0,&local_a4);
      if (bVar1) {
        dVar4 = precise_unit::multiplier((precise_unit *)local_78);
        commodity_code = precise_unit::commodity((precise_unit *)local_78);
        precise_unit::precise_unit(&local_b8,1.0,(precise_unit *)precise::currency,commodity_code);
        precise_measurement::precise_measurement(__return_storage_ptr__,dVar4,&local_b8);
        goto LAB_0018b5ec;
      }
    }
    precise_measurement::precise_measurement
              (__return_storage_ptr__,dStack_28,(precise_unit *)local_78);
  }
LAB_0018b5ec:
  c.commodity_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

precise_measurement measurement_from_string(
    std::string measurement_string,
    std::uint64_t match_flags)
{
    if (measurement_string.empty()) {
        return {};
    }
    // do a cleaning first to get rid of spaces and other issues
    match_flags &= (~skip_code_replacements);
    cleanUnitString(measurement_string, match_flags);

    size_t loc{0};
    auto val = generateLeadingNumber(measurement_string, loc);
    if (loc == 0) {
        val = readNumericalWords(measurement_string, loc);
    }
    if (loc == 0) {
        val = 1.0;
    }
    if (loc >= measurement_string.length()) {
        return {val, precise::one};
    }
    bool checkCurrency = (loc == 0);
    auto ustring = measurement_string.substr(loc);
    auto validString = checkValidUnitString(ustring, match_flags);
    auto un = (validString) ?
        unit_from_string_internal(
            std::move(ustring), match_flags | skip_code_replacements) :
        precise::invalid;
    if (!is_error(un)) {
        if (checkCurrency) {
            if (un.base_units() == precise::currency.base_units()) {
                return {
                    un.multiplier(),
                    precise_unit(1.0, precise::currency, un.commodity())};
            }
        }
        return {val, un};
    }
    if (checkCurrency) {
        auto c = get_unit(measurement_string.substr(0, 1), match_flags);
        if (c == precise::currency) {
            auto mstr = measurement_from_string(
                measurement_string.substr(1), match_flags);
            return mstr * c;
        }
    }

    // deal with some specifics
    /*
    if (measurement_string[loc] == '\'')
    {
        double v2 = std::stod(measurement_string.substr(loc + 1), &loc);
        if (measurement_string[loc] == '"')
        {
            return precise_measurement(val, precise::ft) +
    precise_measurement(v2, precise::in);
        }
    }
    */
    auto unit = unit_from_string_internal(
        std::move(measurement_string), match_flags | skip_code_replacements);
    if (is_valid(unit) && !unit.has_same_base(one.base_units())) {
        return {1.0, unit};
    }
    return {val, precise::invalid};
}